

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Jf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  Jf_Par_t Pars;
  char Buffer [200];
  
  Jf_ManSetDefaultPars(&Pars);
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"KCDWaekmdcgvwh");
    iVar3 = globalUtilOptind;
    switch(iVar1) {
    case 0x61:
      Pars.fAreaOnly = Pars.fAreaOnly ^ 1;
      break;
    case 0x62:
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
      goto switchD_002525da_caseD_62;
    case 99:
      Pars.fGenCnf = Pars.fGenCnf ^ 1;
      break;
    case 100:
      Pars.fFuncDsd = Pars.fFuncDsd ^ 1;
      break;
    case 0x65:
      Pars.fOptEdge = Pars.fOptEdge ^ 1;
      break;
    case 0x67:
      Pars.fPureAig = Pars.fPureAig ^ 1;
      break;
    case 0x6b:
      Pars.fCoarsen = Pars.fCoarsen ^ 1;
      break;
    case 0x6d:
      Pars.fCutMin = Pars.fCutMin ^ 1;
      break;
    default:
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-C\" should be followed by a positive integer.\n";
LAB_00252774:
          Abc_Print(-1,pcVar5);
switchD_002525da_caseD_62:
          goto LAB_00252797;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar3 + 1;
        Pars.nCutNum = uVar2;
        if (((int)uVar2 < 1) || (Pars.nCutNumMax < (int)uVar2)) {
          pcVar5 = "This number of cuts (%d) is not supported.\n";
LAB_00252787:
          globalUtilOptind = iVar3 + 1;
          Abc_Print(-1,pcVar5,(ulong)uVar2);
          goto switchD_002525da_caseD_62;
        }
      }
      else if (iVar1 == 0x44) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-D\" should be followed by a floating point number.\n";
          goto LAB_00252774;
        }
        Pars.DelayTarget = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar3 + 1;
        if (Pars.DelayTarget < 1) {
LAB_00252797:
          if (Pars.DelayTarget == -1) {
            builtin_strncpy(Buffer + 8,"sible",6);
            builtin_strncpy(Buffer,"best pos",8);
          }
          else {
            sprintf(Buffer,"%d",(ulong)(uint)Pars.DelayTarget);
          }
          iVar3 = -2;
          Abc_Print(-2,"usage: &jf [-KCDW num] [-akmdcgvwh]\n");
          Abc_Print(-2,"\t           performs technology mapping of the network\n");
          Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                    (ulong)(uint)Pars.nLutSizeMax,(ulong)(uint)Pars.nLutSize);
          Abc_Print(-2,
                    "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                    (ulong)(uint)Pars.nCutNumMax,(ulong)(uint)Pars.nCutNum);
          Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                    Buffer);
          Abc_Print(-2,
                    "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n"
                    ,(ulong)(uint)Pars.nVerbLimit);
          pcVar6 = "yes";
          pcVar5 = "yes";
          if (Pars.fAreaOnly == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          if (Pars.fOptEdge == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          if (Pars.fCoarsen == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          if (Pars.fCutMin == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          if (Pars.fFuncDsd == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-d       : toggles using DSD to represent cut functions [default = %s]\n",
                    pcVar5);
          pcVar5 = "yes";
          if (Pars.fGenCnf == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-c       : toggles mapping for CNF generation [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          if (Pars.fPureAig == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-g       : toggles generating AIG without mapping [default = %s]\n",pcVar5
                   );
          pcVar5 = "yes";
          if (Pars.fVerbose == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar5);
          if (Pars.fVeryVerbose == 0) {
            pcVar6 = "no";
          }
          Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar6);
          pcVar5 = "\t-h       : prints the command usage\n";
LAB_00252978:
          Abc_Print(iVar3,pcVar5);
          return 1;
        }
      }
      else if (iVar1 == 0x4b) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-K\" should be followed by a positive integer.\n";
          goto LAB_00252774;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar3 + 1;
        Pars.nLutSize = uVar2;
        if (((int)uVar2 < 2) || (Pars.nLutSizeMax < (int)uVar2)) {
          pcVar5 = "LUT size %d is not supported.\n";
          goto LAB_00252787;
        }
      }
      else if (iVar1 == 0x57) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-W\" should be followed by a positive integer.\n";
          goto LAB_00252774;
        }
        Pars.nVerbLimit = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar3 + 1;
        if (Pars.nVerbLimit < 0) goto switchD_002525da_caseD_62;
      }
      else if (iVar1 == 0x76) {
        Pars.fVerbose = Pars.fVerbose ^ 1;
      }
      else {
        if (iVar1 != 0x77) {
          if (iVar1 != -1) goto switchD_002525da_caseD_62;
          pGVar4 = pAbc->pGia;
          if (pGVar4 == (Gia_Man_t *)0x0) {
            pcVar5 = "Empty GIA network.\n";
          }
          else if (pGVar4->nBufs == 0) {
            if ((Pars.fGenCnf == 0 && Pars.fFuncDsd == 0) || (Pars.nLutSize < 7)) {
              if (Pars.fGenCnf != 0 || Pars.fFuncDsd != 0) {
                iVar3 = Sdm_ManCanRead();
                if (iVar3 == 0) {
                  pcVar5 = "Abc_CommandAbc9Jf(): Cannot input DSD data from file.\n";
                  goto LAB_002529fe;
                }
                pGVar4 = pAbc->pGia;
              }
              pGVar4 = Jf_ManPerformMapping(pGVar4,&Pars);
              if (pGVar4 != (Gia_Man_t *)0x0) {
                Abc_FrameUpdateGia(pAbc,pGVar4);
                return 0;
              }
              pcVar5 = "Abc_CommandAbc9Jf(): Mapping into LUTs has failed.\n";
            }
            else {
              pcVar5 = "Abc_CommandAbc9Jf(): DSD computation works for LUT6 or less.\n";
            }
          }
          else {
            pcVar5 = "Abc_CommandAbc9Jf(): This command does not work with barrier buffers.\n";
          }
LAB_002529fe:
          iVar3 = -1;
          goto LAB_00252978;
        }
        Pars.fVeryVerbose = Pars.fVeryVerbose ^ 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Jf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Jf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCDWaekmdcgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'd':
            pPars->fFuncDsd ^= 1;
            break;
        case 'c':
            pPars->fGenCnf ^= 1;
            break;
        case 'g':
            pPars->fPureAig ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( (pPars->fFuncDsd || pPars->fGenCnf) && pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): DSD computation works for LUT6 or less.\n" );
        return 1;
    }

    if ( (pPars->fFuncDsd || pPars->fGenCnf) && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): Cannot input DSD data from file.\n" );
        return 1;
    }

    pNew = Jf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &jf [-KCDW num] [-akmdcgvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n", pPars->nVerbLimit );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles using DSD to represent cut functions [default = %s]\n", pPars->fFuncDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles mapping for CNF generation [default = %s]\n", pPars->fGenCnf? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}